

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

Value * DumpToJsonArray(Value *__return_storage_ptr__,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *values)

{
  Value *pVVar1;
  Value *extraout_RAX;
  Value *pVVar2;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  pVVar2 = (Value *)(values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar1 = extraout_RAX;
  while (pVVar2 != (Value *)&(values->_M_t)._M_impl.super__Rb_tree_header) {
    Json::Value::Value(&VStack_48,(String *)&pVVar2->limit_);
    Json::Value::append(__return_storage_ptr__,&VStack_48);
    Json::Value::~Value(&VStack_48);
    pVVar2 = (Value *)std::_Rb_tree_increment((_Rb_tree_node_base *)pVVar2);
    pVVar1 = pVVar2;
  }
  return pVVar1;
}

Assistant:

static Json::Value DumpToJsonArray(const std::set<std::string>& values)
{
  Json::Value jsonArray = Json::arrayValue;
  for (const auto& it : values) {
    jsonArray.append(it);
  }
  return jsonArray;
}